

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::dataChanged
          (QAbstractItemModelTesterPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QObject *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(topLeft);
  iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar2,(uchar *)"topLeft.isValid()",0x14fb13,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3e4);
  if ((char)iVar3 != '\0') {
    bVar2 = QModelIndex::isValid(bottomRight);
    iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar2,(uchar *)"bottomRight.isValid()",0x14fb13,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3e5);
    if ((char)iVar3 != '\0') {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)&local_58,bottomRight);
      QModelIndex::parent(&local_70,topLeft);
      bVar2 = compare<QModelIndex,QModelIndex>
                        (this,&local_70,(QModelIndex *)&local_58,"topLeft.parent()","commonParent",
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,999);
      if (bVar2) {
        iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(topLeft->r <= bottomRight->r),
                       (uchar *)"topLeft.row() <= bottomRight.row()",0x14fb13,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,1000);
        if ((char)iVar3 != '\0') {
          iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(topLeft->c <= bottomRight->c),
                         (uchar *)"topLeft.column() <= bottomRight.column()",0x14fb13,
                         (uchar *)
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,0x3e9);
          if ((char)iVar3 != '\0') {
            pQVar1 = (this->model).wp.value;
            iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
            pQVar1 = (this->model).wp.value;
            iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_58);
            iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(bottomRight->r < iVar3),
                           (uchar *)"bottomRight.row() < rowCount",0x14fb13,
                           (uchar *)
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x3ec);
            if ((char)iVar3 != '\0') {
              verify(this,(EVP_PKEY_CTX *)(ulong)(bottomRight->c < iVar4),
                     (uchar *)"bottomRight.column() < columnCount",0x14fb13,
                     (uchar *)
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3ed);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    MODELTESTER_VERIFY(topLeft.isValid());
    MODELTESTER_VERIFY(bottomRight.isValid());
    QModelIndex commonParent = bottomRight.parent();
    MODELTESTER_COMPARE(topLeft.parent(), commonParent);
    MODELTESTER_VERIFY(topLeft.row() <= bottomRight.row());
    MODELTESTER_VERIFY(topLeft.column() <= bottomRight.column());
    int rowCount = model->rowCount(commonParent);
    int columnCount = model->columnCount(commonParent);
    MODELTESTER_VERIFY(bottomRight.row() < rowCount);
    MODELTESTER_VERIFY(bottomRight.column() < columnCount);
}